

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

void Curl_cookie_clearsess(CookieInfo *cookies)

{
  Cookie *pCVar1;
  Cookie *pCVar2;
  Cookie *co;
  Cookie *pCVar3;
  long lVar4;
  Cookie *pCVar5;
  
  if (cookies != (CookieInfo *)0x0) {
    for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
      pCVar5 = cookies->cookies[lVar4];
      pCVar3 = pCVar5;
      pCVar1 = pCVar5;
      if (pCVar5 != (Cookie *)0x0) {
        while (co = pCVar1, pCVar2 = pCVar3, co != (Cookie *)0x0) {
          pCVar1 = co->next;
          pCVar3 = co;
          if (co->expires == 0) {
            if (pCVar5 == co) {
              pCVar5 = pCVar1;
            }
            pCVar3 = pCVar1;
            if (pCVar2 != co) {
              pCVar2->next = pCVar1;
              pCVar3 = pCVar2;
            }
            freecookie(co);
            cookies->numcookies = cookies->numcookies + -1;
          }
        }
        cookies->cookies[lVar4] = pCVar5;
      }
    }
  }
  return;
}

Assistant:

void Curl_cookie_clearsess(struct CookieInfo *cookies)
{
  struct Cookie *first, *curr, *next, *prev = NULL;
  unsigned int i;

  if(!cookies)
    return;

  for(i = 0; i < COOKIE_HASH_SIZE; i++) {
    if(!cookies->cookies[i])
      continue;

    first = curr = prev = cookies->cookies[i];

    for(; curr; curr = next) {
      next = curr->next;
      if(!curr->expires) {
        if(first == curr)
          first = next;

        if(prev == curr)
          prev = next;
        else
          prev->next = next;

        freecookie(curr);
        cookies->numcookies--;
      }
      else
        prev = curr;
    }

    cookies->cookies[i] = first;
  }
}